

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
emplace_back<wchar_t_const*,jsoncons::semantic_tag>
          (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *this,wchar_t **args,
          semantic_tag *args_1)

{
  long lVar1;
  json_runtime_error<std::domain_error,_void> *this_00;
  string local_38;
  
  for (; ((byte)*this & 0xf) == 9;
      this = *(basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> **)(this + 8)) {
  }
  if (((byte)*this & 0xf) == 0xe) {
    lVar1 = *(long *)(this + 8);
    std::
    vector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>>
    ::emplace_back<wchar_t_const*,jsoncons::semantic_tag>
              ((vector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>>
                *)(lVar1 + 8),args,args_1);
    return (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
           (*(long *)(lVar1 + 0x10) + -0x10);
  }
  this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Attempting to insert into a value that is not an array","");
  json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
              json_runtime_error<std::domain_error,_void>::~json_runtime_error);
}

Assistant:

basic_json& emplace_back(Args&&... args)
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    return cast<array_storage>().value().emplace_back(std::forward<Args>(args)...);
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().emplace_back(std::forward<Args>(args)...);
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to insert into a value that is not an array"));
            }
        }